

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O0

void __thiscall
ear::QuadRegion::QuadRegion(QuadRegion *this,VectorXi *outputChannels,MatrixXd *positions)

{
  Matrix<double,__1,__1,_0,__1,__1> local_1e8;
  Matrix3d local_1d0;
  Matrix<double,__1,__1,_0,__1,__1> local_188;
  Matrix3d local_170;
  Scalar local_128 [4];
  Matrix<int,_4,_1,_0,_4,_1> local_118;
  type local_108;
  undefined1 local_d0 [8];
  MatrixXd reorderedAndShiftedPositions;
  undefined1 local_98 [8];
  MatrixXd reorderedPositions;
  Matrix<int,__1,_1,_0,__1,_1> local_68 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_48;
  Matrix<int,__1,_1,_0,__1,_1> local_30;
  MatrixXd *local_20;
  MatrixXd *positions_local;
  VectorXi *outputChannels_local;
  QuadRegion *this_local;
  
  local_20 = positions;
  positions_local = (MatrixXd *)outputChannels;
  outputChannels_local = (VectorXi *)this;
  Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::Matrix(&local_30,outputChannels);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&local_48,positions);
  RegionHandler::RegionHandler(&this->super_RegionHandler,&local_30,&local_48);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_48);
  Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix(&local_30);
  (this->super_RegionHandler)._vptr_RegionHandler = (_func_int **)&PTR_handle_003d75a0;
  Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::Matrix(&this->_order);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(&this->_polyBasisX);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(&this->_polyBasisY);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &reorderedPositions.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols,positions);
  ngonVertexOrder((ear *)local_68,
                  (MatrixXd *)
                  &reorderedPositions.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
                 );
  Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::operator=(&this->_order,local_68);
  Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix(local_68);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &reorderedPositions.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator()
            ((type *)&reorderedAndShiftedPositions.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_cols,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)positions,
             &this->_order,(all_t *)&Eigen::all);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::IndexedView<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<int,_1,1,0,_1,1>,Eigen::internal::AllRange<_1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_98,
             (EigenBase<Eigen::IndexedView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_Eigen::internal::AllRange<_1>_>_>
              *)&reorderedAndShiftedPositions.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Eigen::
  IndexedView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_Eigen::internal::AllRange<-1>_>
  ::~IndexedView((IndexedView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_Eigen::internal::AllRange<_1>_>
                  *)&reorderedAndShiftedPositions.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_cols);
  local_128[3] = 1;
  local_128[2] = 2;
  local_128[1] = 3;
  local_128[0] = 0;
  Eigen::Matrix<int,_4,_1,_0,_4,_1>::Matrix
            (&local_118,local_128 + 3,local_128 + 2,local_128 + 1,local_128);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator()
            (&local_108,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_98,&local_118,
             (all_t *)&Eigen::all);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::IndexedView<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<int,4,1,0,4,1>,Eigen::internal::AllRange<_1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_d0,
             (EigenBase<Eigen::IndexedView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_Eigen::internal::AllRange<_1>_>_>
              *)&local_108);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            (&local_188,(Matrix<double,__1,__1,_0,__1,__1> *)local_98);
  _calcPolyBasis(&local_170,this,&local_188);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=(&this->_polyBasisX,&local_170);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_188);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            (&local_1e8,(Matrix<double,__1,__1,_0,__1,__1> *)local_d0);
  _calcPolyBasis(&local_1d0,this,&local_1e8);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=(&this->_polyBasisY,&local_1d0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_1e8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_d0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_98);
  return;
}

Assistant:

QuadRegion::QuadRegion(Eigen::VectorXi outputChannels,
                         Eigen::MatrixXd positions)
      : RegionHandler(outputChannels, positions) {
    _order = ngonVertexOrder(positions);
    Eigen::MatrixXd reorderedPositions =
        positions(_order, Eigen::indexing::all);
    Eigen::MatrixXd reorderedAndShiftedPositions =
        reorderedPositions(Eigen::Vector4i{1, 2, 3, 0}, Eigen::indexing::all);
    _polyBasisX = _calcPolyBasis(reorderedPositions);
    _polyBasisY = _calcPolyBasis(reorderedAndShiftedPositions);
  }